

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  jpgd_block_t *pjVar1;
  uint uVar2;
  uint local_34;
  jpgd_block_t *p;
  uint local_20;
  int r;
  int s;
  int block_y_local;
  int block_x_local;
  int component_id_local;
  jpeg_decoder *pD_local;
  
  pjVar1 = coeff_buf_getp(pD,pD->m_dc_coeffs[component_id],block_x,block_y);
  local_20 = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]]);
  if (local_20 != 0) {
    local_34 = get_bits_no_markers(pD,local_20);
    if ((int)local_34 < *(int *)(s_extend_test + (long)(int)(local_20 & 0xf) * 4)) {
      local_34 = local_34 + *(int *)(s_extend_offset + (long)(int)(local_20 & 0xf) * 4);
    }
    local_20 = local_34;
  }
  uVar2 = pD->m_last_dc_val[component_id] + local_20;
  pD->m_last_dc_val[component_id] = uVar2;
  *pjVar1 = (jpgd_block_t)(uVar2 << ((byte)pD->m_successive_low & 0x1f));
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder *pD, int component_id, int block_x, int block_y)
{
  int s, r;
  jpgd_block_t *p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

  if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0)
  {
    r = pD->get_bits_no_markers(s);
    s = JPGD_HUFF_EXTEND(r, s);
  }

  pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

  p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
}